

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface.cc
# Opt level: O1

TimeStamp __thiscall RealDiskInterface::Stat(RealDiskInterface *this,string *path,string *err)

{
  Metrics *this_00;
  int iVar1;
  int *piVar2;
  long *plVar3;
  Metric *pMVar4;
  long *plVar5;
  TimeStamp TVar6;
  ScopedMetric metrics_h_scoped;
  stat st;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ScopedMetric local_e8;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  stat local_b8;
  
  if ((Stat(std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Stat(std::__cxx11::string_const&,std::__cxx11::string*)::
                                   metrics_h_metric), this_00 = g_metrics, iVar1 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar4 = (Metric *)0x0;
    }
    else {
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"node stat","");
      pMVar4 = Metrics::NewMetric(this_00,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
    }
    Stat::metrics_h_metric = pMVar4;
    __cxa_guard_release(&Stat(std::__cxx11::string_const&,std::__cxx11::string*)::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_e8,Stat::metrics_h_metric);
  iVar1 = stat((path->_M_dataplus)._M_p,&local_b8);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    TVar6 = 0;
    if ((*piVar2 != 2) && (*piVar2 != 0x14)) {
      std::operator+(&local_108,"stat(",path);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_108);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_138 = *plVar5;
        lStack_130 = plVar3[3];
        local_148 = &local_138;
      }
      else {
        local_138 = *plVar5;
        local_148 = (long *)*plVar3;
      }
      local_140 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      strerror(*piVar2);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_148);
      plVar5 = plVar3 + 2;
      if ((long *)*plVar3 == plVar5) {
        local_c8 = *plVar5;
        lStack_c0 = plVar3[3];
        local_d8 = &local_c8;
      }
      else {
        local_c8 = *plVar5;
        local_d8 = (long *)*plVar3;
      }
      local_d0 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)err,(string *)&local_d8);
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_148 != &local_138) {
        operator_delete(local_148,local_138 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      TVar6 = -1;
    }
  }
  else if (local_b8.st_mtim.tv_sec == 0) {
    TVar6 = 1;
  }
  else {
    TVar6 = local_b8.st_mtim.tv_sec * 1000000000 + local_b8.st_mtim.tv_nsec;
  }
  ScopedMetric::~ScopedMetric(&local_e8);
  return TVar6;
}

Assistant:

TimeStamp RealDiskInterface::Stat(const string& path, string* err) const {
  METRIC_RECORD("node stat");
#ifdef _WIN32
  // MSDN: "Naming Files, Paths, and Namespaces"
  // http://msdn.microsoft.com/en-us/library/windows/desktop/aa365247(v=vs.85).aspx
  if (!path.empty() && path[0] != '\\' && path.size() > MAX_PATH) {
    ostringstream err_stream;
    err_stream << "Stat(" << path << "): Filename longer than " << MAX_PATH
               << " characters";
    *err = err_stream.str();
    return -1;
  }
  if (!use_cache_)
    return StatSingleFile(path, err);

  string dir = DirName(path);
  string base(path.substr(dir.size() ? dir.size() + 1 : 0));
  if (base == "..") {
    // StatAllFilesInDir does not report any information for base = "..".
    base = ".";
    dir = path;
  }

  string dir_lowercase = dir;
  transform(dir.begin(), dir.end(), dir_lowercase.begin(), ::tolower);
  transform(base.begin(), base.end(), base.begin(), ::tolower);

  Cache::iterator ci = cache_.find(dir_lowercase);
  if (ci == cache_.end()) {
    ci = cache_.insert(make_pair(dir_lowercase, DirCache())).first;
    if (!StatAllFilesInDir(dir.empty() ? "." : dir, &ci->second, err)) {
      cache_.erase(ci);
      return -1;
    }
  }
  DirCache::iterator di = ci->second.find(base);
  return di != ci->second.end() ? di->second : 0;
#else
  struct stat st;
  if (stat(path.c_str(), &st) < 0) {
    if (errno == ENOENT || errno == ENOTDIR)
      return 0;
    *err = "stat(" + path + "): " + strerror(errno);
    return -1;
  }
  // Some users (Flatpak) set mtime to 0, this should be harmless
  // and avoids conflicting with our return value of 0 meaning
  // that it doesn't exist.
  if (st.st_mtime == 0)
    return 1;
#if defined(_AIX)
  return (int64_t)st.st_mtime * 1000000000LL + st.st_mtime_n;
#elif defined(__APPLE__)
  return ((int64_t)st.st_mtimespec.tv_sec * 1000000000LL +
          st.st_mtimespec.tv_nsec);
#elif defined(st_mtime) // A macro, so we're likely on modern POSIX.
  return (int64_t)st.st_mtim.tv_sec * 1000000000LL + st.st_mtim.tv_nsec;
#else
  return (int64_t)st.st_mtime * 1000000000LL + st.st_mtimensec;
#endif
#endif
}